

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfile.c
# Opt level: O2

pboolean p_file_is_exists(pchar *file)

{
  int iVar1;
  
  if (file != (pchar *)0x0) {
    iVar1 = access(file,0);
    return (uint)(iVar1 == 0);
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_file_is_exists (const pchar *file)
{
#ifdef P_OS_WIN
	DWORD attrs;
#endif

	if (P_UNLIKELY (file == NULL))
		return FALSE;

#ifdef P_OS_WIN
	attrs = GetFileAttributesA ((LPCSTR) file);

	return (attrs != INVALID_FILE_ATTRIBUTES && (attrs & FILE_ATTRIBUTE_DIRECTORY) == 0);
#else
	return access (file, F_OK) == 0;
#endif
}